

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigs.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  size_t sVar2;
  ssize_t sVar3;
  char *pcVar4;
  long in_RSI;
  int in_EDI;
  char v [65536];
  cmdScript_t s;
  cmdCtlParse_t ctl;
  uintptr_t p [10];
  cmdCmd_t cmd;
  int len;
  int l;
  int pp;
  int i;
  int idx;
  int args;
  int command;
  int sock;
  int in_stack_fffffffffffeff1c;
  int in_stack_fffffffffffeff20;
  uint in_stack_fffffffffffeff24;
  char **in_stack_fffffffffffeff28;
  int in_stack_fffffffffffeff30;
  int in_stack_fffffffffffeff34;
  cmdCmd_t in_stack_fffffffffffeff38;
  cmdCtlParse_t *in_stack_fffffffffffeff88;
  char *in_stack_fffffffffffeff90;
  uint in_stack_fffffffffffeff9c;
  uintptr_t *in_stack_fffffffffffeffa0;
  char *in_stack_fffffffffffeffa8;
  void *local_d0;
  int local_98;
  size_t local_80;
  undefined1 local_40 [12];
  undefined4 uStack_34;
  int local_30;
  uint local_2c;
  uint local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_14;
  long local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  local_14 = openSocket();
  local_24 = initOpts(in_stack_fffffffffffeff34,in_stack_fffffffffffeff28);
  command_buf[0] = '\0';
  local_2c = 0;
  local_28 = 0;
  local_1c = local_24;
  for (; local_24 < local_8; local_24 = local_24 + 1) {
    sVar2 = strlen(*(char **)(local_10 + (long)local_24 * 8));
    local_2c = local_2c + (int)sVar2 + 1;
    if (local_2c < 0x10000) {
      sprintf(command_buf + (int)local_28,"%s ",*(undefined8 *)(local_10 + (long)local_24 * 8));
      local_28 = local_2c;
    }
  }
  if (local_28 != 0) {
    local_28 = local_28 - 1;
    command_buf[(int)local_28] = '\0';
  }
  sVar2 = strlen(command_buf);
  local_30 = (int)sVar2;
  local_20 = 0;
  while( true ) {
    uVar1 = in_stack_fffffffffffeff24 & 0xffffff;
    if (-1 < local_20) {
      uVar1 = CONCAT13(0 < local_30,(int3)in_stack_fffffffffffeff24);
    }
    in_stack_fffffffffffeff24 = uVar1;
    if ((char)(in_stack_fffffffffffeff24 >> 0x18) == '\0') break;
    local_20 = cmdParse(in_stack_fffffffffffeffa8,in_stack_fffffffffffeffa0,
                        in_stack_fffffffffffeff9c,in_stack_fffffffffffeff90,
                        in_stack_fffffffffffeff88);
    if (local_20 < 0) {
      if (local_20 == -1) {
        pcVar4 = cmdStr();
        report(0xfd,"%s? unknown command, pigs h for help",pcVar4);
      }
      else {
        pcVar4 = cmdStr();
        report(0xfd,"%s: bad parameter, pigs h for help",pcVar4);
      }
    }
    else if (local_98 < 800) {
      if (local_98 == 0x19) {
        printf("%s",cmdUsage);
      }
      else if (local_98 == 0x30) {
        cmdParseScript((char *)v._376_8_,(cmdScript_t *)v._368_8_,v._364_4_);
        if (local_d0 != (void *)0x0) {
          free(local_d0);
        }
      }
      else {
        uStack_34 = (undefined4)local_80;
        if (local_14 == -1) {
          report(0xff,"socket connect failed");
        }
        else {
          sVar3 = send(local_14,local_40,0x10,0);
          if (sVar3 == 0x10) {
            if (local_80 != 0) {
              send(local_14,&stack0xfffffffffffeff28,local_80,0);
            }
            sVar3 = recv(local_14,local_40,0x10,0x100);
            if (sVar3 == 0x10) {
              get_extensions(in_stack_fffffffffffeff24,in_stack_fffffffffffeff20,
                             in_stack_fffffffffffeff1c);
              print_result(in_stack_fffffffffffeff34,in_stack_fffffffffffeff30,
                           in_stack_fffffffffffeff38);
            }
            else {
              report(0xff,"socket receive failed");
            }
          }
          else {
            report(0xff,"socket send failed");
          }
        }
      }
    }
    else {
      report(0xfd,"%s only allowed within a script",cmdInfo[local_20].name);
    }
  }
  if (-1 < local_14) {
    close(local_14);
  }
  return status;
}

Assistant:

int main(int argc , char *argv[])
{
   int sock, command;
   int args, idx, i, pp, l, len;
   cmdCmd_t cmd;
   uintptr_t p[CMD_P_ARR];
   cmdCtlParse_t ctl;
   cmdScript_t s;
   char v[CMD_MAX_EXTENSION];

   sock = openSocket();

   args = initOpts(argc, argv);

   command_buf[0] = 0;
   l = 0;
   pp = 0;

   for (i=args; i<argc; i++)
   {
      l += (strlen(argv[i]) + 1);
      if (l < sizeof(command_buf))
         {sprintf(command_buf+pp, "%s ", argv[i]); pp=l;}
   }

   if (pp) {command_buf[--pp] = 0;}

   ctl.eaten = 0;

   len = strlen(command_buf);
   idx = 0;

   while ((idx >= 0) && (ctl.eaten < len))
   {
      if ((idx=cmdParse(command_buf, p, CMD_MAX_EXTENSION, v, &ctl)) >= 0)
      {
         command = p[0];

         if (command < PI_CMD_SCRIPT)
         {
            if (command == PI_CMD_HELP)
            {
               printf("%s", cmdUsage);
            }
            else if (command == PI_CMD_PARSE)
            {
               cmdParseScript(v, &s, 1);
               if (s.par) free (s.par);
            }
            else
            {
               cmd.cmd = command;
               cmd.p1 = p[1];
               cmd.p2 = p[2];
               cmd.p3 = p[3];

               if (sock != SOCKET_OPEN_FAILED)
               {
                  if (send(sock, &cmd, sizeof(cmdCmd_t), 0) ==
                     sizeof(cmdCmd_t))
                  {
                     if (p[3]) send(sock, v, p[3], 0); /* send extensions */

                     if (recv(sock, &cmd, sizeof(cmdCmd_t), MSG_WAITALL) ==
                        sizeof(cmdCmd_t))
                     {
                        get_extensions(sock, command, cmd.res);

                        print_result(sock, cmdInfo[idx].rv, cmd);
                     }
                     else report(PIGS_CONNECT_ERR, "socket receive failed");
                  }
                  else report(PIGS_CONNECT_ERR, "socket send failed");
               }
               else report(PIGS_CONNECT_ERR, "socket connect failed");
            }
         }
         else report(PIGS_SCRIPT_ERR,
                 "%s only allowed within a script", cmdInfo[idx].name);
      }
      else
      {
         if (idx == CMD_UNKNOWN_CMD)
            report(PIGS_SCRIPT_ERR,
               "%s? unknown command, pigs h for help", cmdStr());
         else
            report(PIGS_SCRIPT_ERR,
               "%s: bad parameter, pigs h for help", cmdStr());
      }
   }

   if (sock >= 0) close(sock);

   return status;
}